

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

vectorTy * CoordVectorBetween(positionTy *from,positionTy *to)

{
  bool bVar1;
  positionTy *in_RDX;
  positionTy *in_RSI;
  vectorTy *in_RDI;
  double dVar2;
  double dAngle;
  double dVar3;
  double dVar4;
  double dist;
  double d_ts;
  undefined8 local_68;
  positionTy *in_stack_ffffffffffffffa8;
  positionTy *in_stack_ffffffffffffffb0;
  
  local_68 = positionTy::ts(in_RDX);
  dVar2 = positionTy::ts(in_RSI);
  local_68 = local_68 - dVar2;
  dVar2 = CoordDistance(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  dAngle = CoordAngle(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = dequal(local_68,0.0);
  if (bVar1) {
    dVar3 = INFINITY;
  }
  else {
    dVar3 = positionTy::alt_m(in_RDX);
    dVar4 = positionTy::alt_m(in_RSI);
    dVar3 = (dVar3 - dVar4) / local_68;
  }
  bVar1 = dequal(local_68,0.0);
  if (bVar1) {
    local_68 = INFINITY;
  }
  else {
    local_68 = dVar2 / local_68;
  }
  vectorTy::vectorTy(in_RDI,dAngle,dVar2,dVar3,local_68);
  return in_RDI;
}

Assistant:

vectorTy CoordVectorBetween (const positionTy& from, const positionTy& to )
{
    double d_ts = to.ts() - from.ts();
    double dist = CoordDistance (from, to);
    return vectorTy (CoordAngle (from, to),         // angle
                     dist,                          // dist
                     dequal(d_ts,0) ? INFINITY :    // vsi
                        (to.alt_m()-from.alt_m())/d_ts,
                     dequal(d_ts,0) ? INFINITY :    // spped
                        dist/d_ts);
}